

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<std::function<void(ot::commissioner::BorderAgent_const*,ot::commissioner::Error_const&)>>
               (function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>
                *value,ostream *os)

{
  ostream *os_local;
  function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>
  *value_local;
  
  FallbackPrinter::
  PrintValue<std::function<void(ot::commissioner::BorderAgent_const*,ot::commissioner::Error_const&)>>
            (value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}